

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

int regcomp(regex_t *__preg,char *__pattern,int __cflags)

{
  ulong uVar1;
  cat_t *pcVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  re_guts *__ptr;
  sop *psVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  sop *extraout_RDX;
  sop *psVar12;
  sop sVar13;
  cat_t cVar14;
  sop *psVar15;
  sop *psVar16;
  int iVar17;
  uch *puVar18;
  ulong uVar19;
  uint uVar20;
  sop *psVar21;
  long lVar22;
  parse pa;
  parse local_110;
  
  psVar21 = (sop *)0x10;
  if ((~__cflags & 0x11U) == 0) goto LAB_001039a5;
  if ((__cflags & 0x20U) == 0) {
    sVar5 = strlen(__pattern);
  }
  else {
    sVar5 = (long)__preg->used - (long)__pattern;
    if ((char *)__preg->used < __pattern) goto LAB_001039a5;
  }
  __ptr = (re_guts *)malloc(399);
  if (__ptr != (re_guts *)0x0) {
    local_110.ssize = (sVar5 >> 1) * 3 + 1;
    if ((ulong)local_110.ssize < sVar5 || (ulong)local_110.ssize >> 0x3c != 0) {
      free(__ptr);
      goto LAB_001039a5;
    }
    local_110.strip = (sop *)malloc(local_110.ssize * 8);
    local_110.slen = 0;
    if (local_110.strip != (sop *)0x0) {
      local_110.end = __pattern + sVar5;
      local_110.error = 0;
      local_110.ncsalloc = 0;
      local_110.next = __pattern;
      local_110.g = __ptr;
      memset(local_110.pbegin,0,0xa0);
      __ptr->csetsize = 0x100;
      *(undefined8 *)&__ptr->ncsets = 0;
      *(undefined8 *)((long)&__ptr->sets + 4) = 0;
      *(undefined4 *)((long)&__ptr->setbits + 4) = 0;
      __ptr->cflags = __cflags;
      __ptr->iflags = 0;
      __ptr->nbol = 0;
      __ptr->neol = 0;
      __ptr->ncategories = 1;
      __ptr->must = (char *)0x0;
      __ptr->mlen = 0;
      __ptr->nsub = 0;
      __ptr->categories = (cat_t *)&__ptr[1].backrefs;
      memset(__ptr->catspace,0,0x100);
      __ptr->backrefs = 0;
      doemit(&local_110,0x4000000,0);
      __ptr->firststate = local_110.slen + -1;
      if ((__cflags & 1U) == 0) {
        if ((__cflags & 0x10U) == 0) {
          p_bre(&local_110,0x80,0x80);
        }
        else {
          p_str(&local_110);
        }
      }
      else {
        p_ere(&local_110,0x80);
      }
      doemit(&local_110,0x4000000,0);
      __ptr->laststate = local_110.slen + -1;
      if (local_110.error == 0) {
        pcVar2 = __ptr->categories;
        uVar11 = 0xffffffffffffff80;
        do {
          if ((pcVar2[uVar11] == '\0') && (iVar17 = __ptr->ncsets, 0 < iVar17)) {
            uVar10 = iVar17 + 7U >> 3;
            puVar18 = __ptr->setbits;
            do {
              if (puVar18[uVar11 & 0xff] != '\0') {
                iVar17 = __ptr->ncategories;
                __ptr->ncategories = iVar17 + 1;
                cVar14 = (cat_t)iVar17;
                pcVar2[uVar11] = cVar14;
                uVar19 = uVar11;
                if ((long)uVar11 < 0x7f) {
                  do {
                    uVar1 = uVar19 + 1;
                    if (pcVar2[uVar19 + 1] == '\0') {
                      iVar17 = __ptr->ncsets;
                      if (0 < iVar17) {
                        uVar10 = iVar17 + 7U >> 3;
                        puVar18 = __ptr->setbits;
                        do {
                          if (puVar18[uVar11 & 0xff] != puVar18[uVar1 & 0xff]) goto LAB_00103778;
                          puVar18 = puVar18 + __ptr->csetsize;
                          uVar10 = uVar10 - 1;
                        } while (uVar10 != 0);
                      }
                      pcVar2[uVar1] = cVar14;
                    }
LAB_00103778:
                    uVar19 = uVar1;
                  } while (uVar1 != 0x7f);
                }
                break;
              }
              puVar18 = puVar18 + __ptr->csetsize;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x80);
      }
      __ptr->nstates = local_110.slen;
      psVar6 = (sop *)realloc(local_110.strip,local_110.slen << 3);
      __ptr->strip = psVar6;
      if (psVar6 == (sop *)0x0) {
        if (local_110.error == 0) {
          local_110.error = 0xc;
        }
        local_110.next = nuls;
        local_110.end = nuls;
        __ptr->strip = local_110.strip;
      }
      else if (local_110.error == 0) {
        iVar17 = 0;
        psVar12 = extraout_RDX;
        psVar15 = psVar6 + 1;
LAB_001037c7:
        psVar16 = psVar15 + 1;
        sVar13 = *psVar15;
        uVar10 = (uint)sVar13;
        uVar11 = (ulong)(uVar10 & 0x7c000000) - 0x8000000 >> 0x1a;
        if (uVar11 < 0xe) {
          iVar4 = iVar17;
          if ((0x1880UL >> (uVar11 & 0x3f) & 1) != 0) goto LAB_00103853;
          if ((0x2200UL >> (uVar11 & 0x3f) & 1) == 0) {
            if (uVar11 == 0) {
              if (iVar17 == 0) {
                psVar12 = psVar15;
              }
              iVar4 = iVar17 + 1;
              goto LAB_00103853;
            }
            goto LAB_00103843;
          }
          do {
            psVar15 = psVar15 + ((uint)sVar13 & 0x3ffffff);
            sVar13 = *psVar15;
            uVar10 = (uint)sVar13;
            uVar20 = uVar10 & 0x7c000000;
          } while (uVar20 == 0x44000000);
          psVar16 = psVar15;
          if ((uVar20 != 0x30000000) && (uVar20 != 0x48000000)) {
            *(byte *)&__ptr->iflags = (byte)__ptr->iflags | 4;
            goto LAB_0010393b;
          }
        }
LAB_00103843:
        iVar4 = 0;
        if (__ptr->mlen < iVar17) {
          __ptr->mlen = iVar17;
          psVar21 = psVar12;
        }
LAB_00103853:
        iVar17 = iVar4;
        psVar15 = psVar16;
        if ((uVar10 & 0x7c000000) == 0x4000000) goto code_r0x0010386b;
        goto LAB_001037c7;
      }
      __ptr->nplus = 0;
      __ptr->magic = 0xd245;
      __preg->allocated = __ptr->nsub;
      __preg->syntax = (reg_syntax_t)__ptr;
      *(undefined4 *)&__preg->buffer = 0xf265;
      regfree(__preg);
      psVar21 = (sop *)(ulong)(uint)local_110.error;
      goto LAB_001039a5;
    }
    free(__ptr);
  }
  psVar21 = (sop *)0xc;
  goto LAB_001039a5;
code_r0x0010386b:
  iVar17 = __ptr->mlen;
  lVar22 = (long)iVar17;
  if (lVar22 != 0) {
    pcVar7 = (char *)malloc(lVar22 + 1);
    __ptr->must = pcVar7;
    if (pcVar7 == (char *)0x0) {
      __ptr->mlen = 0;
    }
    else {
      pcVar8 = pcVar7;
      if (0 < iVar17) {
        lVar9 = lVar22;
        do {
          do {
            sVar13 = *psVar21;
            psVar21 = psVar21 + 1;
          } while (((uint)sVar13 & 0x7c000000) != 0x8000000);
          if (pcVar7 + lVar22 <= pcVar8) {
            __assert_fail("cp < g->must + g->mlen",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x68f,"void findmust()");
          }
          *pcVar8 = (char)sVar13;
          pcVar8 = pcVar8 + 1;
          bVar3 = 1 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar3);
      }
      if (pcVar8 != pcVar7 + lVar22) {
        __assert_fail("cp == g->must + g->mlen",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0x692,"void findmust()");
      }
      pcVar7[lVar22] = '\0';
    }
  }
LAB_0010393b:
  lVar9 = 0;
  lVar22 = 0;
  do {
    psVar6 = psVar6 + 1;
    uVar10 = (uint)*psVar6 & 0x7c000000;
    if (uVar10 == 0x28000000) {
      if (lVar22 < lVar9) {
        lVar22 = lVar9;
      }
      lVar9 = lVar9 + -1;
    }
    else if (uVar10 == 0x24000000) {
      lVar9 = lVar9 + 1;
    }
  } while (uVar10 != 0x4000000);
  if (lVar9 != 0) {
    *(byte *)&__ptr->iflags = (byte)__ptr->iflags | 4;
  }
  __ptr->nplus = lVar22;
  __ptr->magic = 0xd245;
  __preg->allocated = __ptr->nsub;
  __preg->syntax = (reg_syntax_t)__ptr;
  *(undefined4 *)&__preg->buffer = 0xf265;
  psVar21 = (sop *)0x0;
LAB_001039a5:
  return (int)psVar21;
}

Assistant:

int				/* 0 success, otherwise REG_something */
regcomp(preg, pattern, cflags)
regex_t *preg;
const char *pattern;
int cflags;
{
	struct parse pa;
	struct re_guts *g;
	struct parse *p = &pa;
	unsigned int i;
	size_t len;

	if ((cflags&REG_EXTENDED) && (cflags&REG_NOSPEC))
		return(REG_INVARG);

	if (cflags&REG_PEND) {
		if (preg->re_endp < pattern)
			return(REG_INVARG);
		len = (size_t) (preg->re_endp - pattern);
	} else
		len = strlen((char *)pattern);

	/* do the mallocs early so failure handling is easy */
	g = (struct re_guts *)malloc(sizeof(struct re_guts) +
							(NC-1)*sizeof(cat_t));
	if (g == NULL)
		return(REG_ESPACE);
	{
	  /* Patched for CERT Vulnerability Note VU#695940, Feb 2015. */
	  size_t new_ssize = len/(size_t)2*(size_t)3 + (size_t)1; /* ugh */
	  if (new_ssize < len || new_ssize > LONG_MAX / sizeof(sop)) {
	    free((char *) g);
	    return REG_INVARG;
	  }
	  p->ssize = (sopno)new_ssize;
	}
	p->strip = (sop *)malloc((size_t)p->ssize * sizeof(sop));
	p->slen = 0;
	if (p->strip == NULL) {
		free((char *)g);
		return(REG_ESPACE);
	}

	/* set things up */
	p->g = g;
	p->next = (char *)pattern;	/* convenience; we do not modify it */
	p->end = p->next + len;
	p->error = 0;
	p->ncsalloc = 0;
	for (i = 0; i < NPAREN; i++) {
		p->pbegin[i] = 0;
		p->pend[i] = 0;
	}
	g->csetsize = NC;
	g->sets = NULL;
	g->setbits = NULL;
	g->ncsets = 0;
	g->cflags = cflags;
	g->iflags = 0;
	g->nbol = 0;
	g->neol = 0;
	g->must = NULL;
	g->mlen = 0;
	g->nsub = 0;
	g->ncategories = 1;	/* category 0 is "everything else" */
	g->categories = &g->catspace[-(CHAR_MIN)];
	(void) memset((char *)g->catspace, 0, NC*sizeof(cat_t));
	g->backrefs = 0;

	/* do it */
	EMIT(OEND, 0);
	g->firststate = THERE();
	if (cflags&REG_EXTENDED)
		p_ere(p, OUT);
	else if (cflags&REG_NOSPEC)
		p_str(p);
	else
		p_bre(p, OUT, OUT);
	EMIT(OEND, 0);
	g->laststate = THERE();

	/* tidy up loose ends and fill things in */
	categorize(p, g);
	stripsnug(p, g);
	findmust(p, g);
	g->nplus = pluscount(p, g);
	g->magic = MAGIC2;
	preg->re_nsub = g->nsub;
	preg->re_g = g;
	preg->re_magic = MAGIC1;
#ifndef REDEBUG
	/* not debugging, so can't rely on the assert() in regexec() */
	if (g->iflags&BAD)
		seterr(p, REG_ASSERT);
#endif

	/* win or lose, we're done */
	if (p->error != 0)	/* lose */
		regfree(preg);
	return(p->error);
}